

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

dictionary_t dictionary_text_open(char *filename)

{
  int iVar1;
  ulong *t_dictionary;
  void *pvVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __nmemb;
  long lVar8;
  
  t_dictionary = (ulong *)malloc(0x20);
  *t_dictionary = 0x400;
  t_dictionary[1] = 0;
  pvVar2 = malloc(0x4000);
  t_dictionary[2] = (ulong)pvVar2;
  t_dictionary[3] = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
LAB_00102f35:
    dictionary_text_close(t_dictionary);
    t_dictionary = (ulong *)0xffffffffffffffff;
  }
  else {
    pcVar3 = fgets(dictionary_text_open::buff,0x80,__stream);
    if (pcVar3 == (char *)0x0) {
      __nmemb = 0;
    }
    else {
      pvVar2 = (void *)t_dictionary[2];
      lVar8 = 0;
      __nmemb = 0;
      uVar6 = *t_dictionary;
      do {
        uVar7 = uVar6;
        if (uVar6 <= __nmemb) {
          uVar7 = uVar6 * 2;
          pvVar2 = realloc(pvVar2,uVar6 << 5);
        }
        iVar1 = parse_entry(dictionary_text_open::buff,(entry *)((long)pvVar2 + lVar8));
        if (iVar1 == -1) {
          t_dictionary[2] = (ulong)pvVar2;
          *t_dictionary = __nmemb;
          goto LAB_00102f35;
        }
        sVar4 = ucs4len(((entry *)((long)pvVar2 + lVar8))->key);
        if (t_dictionary[1] < sVar4) {
          t_dictionary[1] = sVar4;
        }
        __nmemb = __nmemb + 1;
        pcVar3 = fgets(dictionary_text_open::buff,0x80,__stream);
        lVar8 = lVar8 + 0x10;
        uVar6 = uVar7;
      } while (pcVar3 != (char *)0x0);
      *t_dictionary = uVar7;
      t_dictionary[2] = (ulong)pvVar2;
    }
    fclose(__stream);
    *t_dictionary = __nmemb;
    pvVar2 = realloc((void *)t_dictionary[2],__nmemb << 4);
    t_dictionary[2] = (ulong)pvVar2;
    pvVar5 = malloc(t_dictionary[1] * 4 + 4);
    t_dictionary[3] = (ulong)pvVar5;
    qsort(pvVar2,__nmemb,0x10,qsort_entry_cmp);
  }
  return t_dictionary;
}

Assistant:

dictionary_t dictionary_text_open(const char * filename)
{
	text_dictionary_desc * text_dictionary;
	text_dictionary = (text_dictionary_desc *) malloc(sizeof(text_dictionary_desc));
	text_dictionary->entry_count = INITIAL_DICTIONARY_SIZE;
	text_dictionary->max_length = 0;
	text_dictionary->lexicon = (entry *) malloc(sizeof(entry) * text_dictionary->entry_count);
	text_dictionary->word_buff = NULL;

	static char buff[ENTRY_BUFF_SIZE];

	FILE * fp = fopen(filename,"rb");
	if (fp == NULL)
	{
		dictionary_text_close((dictionary_t) text_dictionary);
		return (dictionary_t) -1;
	}

	size_t i = 0;
	while (fgets(buff, ENTRY_BUFF_SIZE, fp))
	{
		if (i >= text_dictionary->entry_count)
		{
			text_dictionary->entry_count += text_dictionary->entry_count;
			text_dictionary->lexicon = (entry *) realloc(
				text_dictionary->lexicon,
				sizeof(entry) * text_dictionary->entry_count
			);
		}

		if (parse_entry(buff, text_dictionary->lexicon + i) == -1)
		{
			text_dictionary->entry_count = i;
			dictionary_text_close((dictionary_t) text_dictionary);
			return (dictionary_t) -1;
		}

		size_t length = ucs4len(text_dictionary->lexicon[i].key);
		if (length > text_dictionary->max_length)
			text_dictionary->max_length = length;

		i ++;
	}

	fclose(fp);

	text_dictionary->entry_count = i;
	text_dictionary->lexicon = (entry *) realloc(
		text_dictionary->lexicon,
		sizeof(entry) * text_dictionary->entry_count
	);
	text_dictionary->word_buff = (ucs4_t *)
		malloc(sizeof(ucs4_t) * (text_dictionary->max_length + 1));

	qsort(text_dictionary->lexicon,
		text_dictionary->entry_count,
		sizeof(text_dictionary->lexicon[0]),
		qsort_entry_cmp
	);

	return (dictionary_t) text_dictionary;
}